

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walTryBeginRead(Wal *pWal,int *pChanged,int useWal,int cnt)

{
  uint uVar1;
  uint uVar2;
  u8 uVar3;
  int iVar4;
  long lVar5;
  sqlite3_io_methods *psVar6;
  int iVar7;
  sqlite3_file *psVar8;
  int iVar9;
  u32 uVar10;
  u32 *puVar11;
  
  if (5 < cnt) {
    if (100 < (uint)cnt) {
      return 0xf;
    }
    iVar7 = 1;
    if (9 < (uint)cnt) {
      iVar7 = cnt * 0xee + -0x85e;
    }
    (*pWal->pVfs->xSleep)(pWal->pVfs,iVar7);
  }
  if (useWal != 0) {
    puVar11 = *pWal->apWiData + 0x18;
    iVar7 = 0;
    goto LAB_0015a65d;
  }
  iVar7 = walIndexReadHdr(pWal,pChanged);
  if (iVar7 == 0) {
    puVar11 = *pWal->apWiData + 0x18;
    iVar7 = 0;
    if ((*pWal->apWiData)[0x18] == (pWal->hdr).mxFrame) {
      uVar3 = pWal->exclusiveMode;
      iVar7 = 0;
      if (uVar3 == '\0') {
        iVar7 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,6);
        uVar3 = pWal->exclusiveMode;
      }
      if (uVar3 != '\x02') {
        (*pWal->pDbFd->pMethods->xShmBarrier)(pWal->pDbFd);
      }
      if (iVar7 == 5) goto LAB_0015a65d;
      if (iVar7 != 0) {
        return iVar7;
      }
      iVar7 = bcmp(*pWal->apWiData,&pWal->hdr,0x30);
      if (iVar7 != 0) {
        if (pWal->exclusiveMode != '\0') {
          return -1;
        }
        psVar8 = pWal->pDbFd;
        psVar6 = psVar8->pMethods;
        iVar7 = 3;
        goto LAB_0015a886;
      }
      pWal->readLock = 0;
    }
    else {
LAB_0015a65d:
      lVar5 = 0;
      iVar9 = 0;
      uVar10 = 0;
      do {
        uVar2 = puVar11[lVar5 + 2];
        if (uVar10 <= uVar2) {
          uVar1 = (pWal->hdr).mxFrame;
          if (uVar2 <= uVar1) {
            uVar10 = uVar2;
          }
          if (uVar2 <= uVar1) {
            iVar9 = (int)lVar5 + 1;
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if ((pWal->readOnly & 2) == 0) {
        if ((uVar10 < (pWal->hdr).mxFrame) || (iVar9 == 0)) {
          lVar5 = 0;
          do {
            iVar7 = (int)lVar5 + 4;
            if (pWal->exclusiveMode != '\0') {
LAB_0015a806:
              uVar10 = (pWal->hdr).mxFrame;
              puVar11[lVar5 + 2] = uVar10;
              iVar9 = (int)lVar5 + 1;
              if (pWal->exclusiveMode == '\0') {
                (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar7,1,9);
              }
              goto LAB_0015a832;
            }
            iVar4 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar7,1,10);
            if (iVar4 != 5) {
              if (iVar4 != 0) {
                return iVar4;
              }
              goto LAB_0015a806;
            }
            lVar5 = lVar5 + 1;
          } while ((int)lVar5 != 4);
          iVar7 = 5;
          goto LAB_0015a6d8;
        }
      }
      else {
LAB_0015a6d8:
        if (iVar9 == 0) {
          return -(uint)(iVar7 == 5) | 0x208;
        }
      }
LAB_0015a832:
      iVar7 = iVar9 + 3;
      uVar3 = pWal->exclusiveMode;
      if (uVar3 == '\0') {
        iVar4 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar7,1,6);
        if (iVar4 != 0) {
          iVar7 = -1;
LAB_0015a8bd:
          if (iVar4 == 5) {
            return iVar7;
          }
          return iVar4;
        }
        uVar3 = pWal->exclusiveMode;
      }
      if (uVar3 != '\x02') {
        (*pWal->pDbFd->pMethods->xShmBarrier)(pWal->pDbFd);
      }
      if ((puVar11[(long)iVar9 + 1] != uVar10) ||
         (iVar4 = bcmp(*pWal->apWiData,&pWal->hdr,0x30), iVar4 != 0)) {
        if (pWal->exclusiveMode != '\0') {
          return -1;
        }
        psVar8 = pWal->pDbFd;
        psVar6 = psVar8->pMethods;
        goto LAB_0015a886;
      }
      pWal->readLock = (i16)iVar9;
    }
    iVar7 = 0;
  }
  else {
    if (iVar7 != 5) {
      return iVar7;
    }
    if (*pWal->apWiData == (u32 *)0x0) {
      return -1;
    }
    if (pWal->exclusiveMode != '\0') {
      return -1;
    }
    iVar4 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,2,1,6);
    if (iVar4 != 0) {
      iVar7 = 0x105;
      goto LAB_0015a8bd;
    }
    if (pWal->exclusiveMode != '\0') {
      return -1;
    }
    psVar8 = pWal->pDbFd;
    psVar6 = psVar8->pMethods;
    iVar7 = 2;
LAB_0015a886:
    (*psVar6->xShmLock)(psVar8,iVar7,1,5);
    iVar7 = -1;
  }
  return iVar7;
}

Assistant:

static int walTryBeginRead(Wal *pWal, int *pChanged, int useWal, int cnt){
  volatile WalCkptInfo *pInfo;    /* Checkpoint information in wal-index */
  u32 mxReadMark;                 /* Largest aReadMark[] value */
  int mxI;                        /* Index of largest aReadMark[] value */
  int i;                          /* Loop counter */
  int rc = SQLITE_OK;             /* Return code  */

  assert( pWal->readLock<0 );     /* Not currently locked */

  /* Take steps to avoid spinning forever if there is a protocol error.
  **
  ** Circumstances that cause a RETRY should only last for the briefest
  ** instances of time.  No I/O or other system calls are done while the
  ** locks are held, so the locks should not be held for very long. But 
  ** if we are unlucky, another process that is holding a lock might get
  ** paged out or take a page-fault that is time-consuming to resolve, 
  ** during the few nanoseconds that it is holding the lock.  In that case,
  ** it might take longer than normal for the lock to free.
  **
  ** After 5 RETRYs, we begin calling sqlite3OsSleep().  The first few
  ** calls to sqlite3OsSleep() have a delay of 1 microsecond.  Really this
  ** is more of a scheduler yield than an actual delay.  But on the 10th
  ** an subsequent retries, the delays start becoming longer and longer, 
  ** so that on the 100th (and last) RETRY we delay for 21 milliseconds.
  ** The total delay time before giving up is less than 1 second.
  */
  if( cnt>5 ){
    int nDelay = 1;                      /* Pause time in microseconds */
    if( cnt>100 ){
      VVA_ONLY( pWal->lockError = 1; )
      return SQLITE_PROTOCOL;
    }
    if( cnt>=10 ) nDelay = (cnt-9)*238;  /* Max delay 21ms. Total delay 996ms */
    sqlite3OsSleep(pWal->pVfs, nDelay);
  }

  if( !useWal ){
    rc = walIndexReadHdr(pWal, pChanged);
    if( rc==SQLITE_BUSY ){
      /* If there is not a recovery running in another thread or process
      ** then convert BUSY errors to WAL_RETRY.  If recovery is known to
      ** be running, convert BUSY to BUSY_RECOVERY.  There is a race here
      ** which might cause WAL_RETRY to be returned even if BUSY_RECOVERY
      ** would be technically correct.  But the race is benign since with
      ** WAL_RETRY this routine will be called again and will probably be
      ** right on the second iteration.
      */
      if( pWal->apWiData[0]==0 ){
        /* This branch is taken when the xShmMap() method returns SQLITE_BUSY.
        ** We assume this is a transient condition, so return WAL_RETRY. The
        ** xShmMap() implementation used by the default unix and win32 VFS 
        ** modules may return SQLITE_BUSY due to a race condition in the 
        ** code that determines whether or not the shared-memory region 
        ** must be zeroed before the requested page is returned.
        */
        rc = WAL_RETRY;
      }else if( SQLITE_OK==(rc = walLockShared(pWal, WAL_RECOVER_LOCK)) ){
        walUnlockShared(pWal, WAL_RECOVER_LOCK);
        rc = WAL_RETRY;
      }else if( rc==SQLITE_BUSY ){
        rc = SQLITE_BUSY_RECOVERY;
      }
    }
    if( rc!=SQLITE_OK ){
      return rc;
    }
  }

  pInfo = walCkptInfo(pWal);
  if( !useWal && pInfo->nBackfill==pWal->hdr.mxFrame ){
    /* The WAL has been completely backfilled (or it is empty).
    ** and can be safely ignored.
    */
    rc = walLockShared(pWal, WAL_READ_LOCK(0));
    walShmBarrier(pWal);
    if( rc==SQLITE_OK ){
      if( memcmp((void *)walIndexHdr(pWal), &pWal->hdr, sizeof(WalIndexHdr)) ){
        /* It is not safe to allow the reader to continue here if frames
        ** may have been appended to the log before READ_LOCK(0) was obtained.
        ** When holding READ_LOCK(0), the reader ignores the entire log file,
        ** which implies that the database file contains a trustworthy
        ** snapshoT. Since holding READ_LOCK(0) prevents a checkpoint from
        ** happening, this is usually correct.
        **
        ** However, if frames have been appended to the log (or if the log 
        ** is wrapped and written for that matter) before the READ_LOCK(0)
        ** is obtained, that is not necessarily true. A checkpointer may
        ** have started to backfill the appended frames but crashed before
        ** it finished. Leaving a corrupt image in the database file.
        */
        walUnlockShared(pWal, WAL_READ_LOCK(0));
        return WAL_RETRY;
      }
      pWal->readLock = 0;
      return SQLITE_OK;
    }else if( rc!=SQLITE_BUSY ){
      return rc;
    }
  }

  /* If we get this far, it means that the reader will want to use
  ** the WAL to get at content from recent commits.  The job now is
  ** to select one of the aReadMark[] entries that is closest to
  ** but not exceeding pWal->hdr.mxFrame and lock that entry.
  */
  mxReadMark = 0;
  mxI = 0;
  for(i=1; i<WAL_NREADER; i++){
    u32 thisMark = pInfo->aReadMark[i];
    if( mxReadMark<=thisMark && thisMark<=pWal->hdr.mxFrame ){
      assert( thisMark!=READMARK_NOT_USED );
      mxReadMark = thisMark;
      mxI = i;
    }
  }
  /* There was once an "if" here. The extra "{" is to preserve indentation. */
  {
    if( (pWal->readOnly & WAL_SHM_RDONLY)==0
     && (mxReadMark<pWal->hdr.mxFrame || mxI==0)
    ){
      for(i=1; i<WAL_NREADER; i++){
        rc = walLockExclusive(pWal, WAL_READ_LOCK(i), 1);
        if( rc==SQLITE_OK ){
          mxReadMark = pInfo->aReadMark[i] = pWal->hdr.mxFrame;
          mxI = i;
          walUnlockExclusive(pWal, WAL_READ_LOCK(i), 1);
          break;
        }else if( rc!=SQLITE_BUSY ){
          return rc;
        }
      }
    }
    if( mxI==0 ){
      assert( rc==SQLITE_BUSY || (pWal->readOnly & WAL_SHM_RDONLY)!=0 );
      return rc==SQLITE_BUSY ? WAL_RETRY : SQLITE_READONLY_CANTLOCK;
    }

    rc = walLockShared(pWal, WAL_READ_LOCK(mxI));
    if( rc ){
      return rc==SQLITE_BUSY ? WAL_RETRY : rc;
    }
    /* Now that the read-lock has been obtained, check that neither the
    ** value in the aReadMark[] array or the contents of the wal-index
    ** header have changed.
    **
    ** It is necessary to check that the wal-index header did not change
    ** between the time it was read and when the shared-lock was obtained
    ** on WAL_READ_LOCK(mxI) was obtained to account for the possibility
    ** that the log file may have been wrapped by a writer, or that frames
    ** that occur later in the log than pWal->hdr.mxFrame may have been
    ** copied into the database by a checkpointer. If either of these things
    ** happened, then reading the database with the current value of
    ** pWal->hdr.mxFrame risks reading a corrupted snapshot. So, retry
    ** instead.
    **
    ** This does not guarantee that the copy of the wal-index header is up to
    ** date before proceeding. That would not be possible without somehow
    ** blocking writers. It only guarantees that a dangerous checkpoint or 
    ** log-wrap (either of which would require an exclusive lock on
    ** WAL_READ_LOCK(mxI)) has not occurred since the snapshot was valid.
    */
    walShmBarrier(pWal);
    if( pInfo->aReadMark[mxI]!=mxReadMark
     || memcmp((void *)walIndexHdr(pWal), &pWal->hdr, sizeof(WalIndexHdr))
    ){
      walUnlockShared(pWal, WAL_READ_LOCK(mxI));
      return WAL_RETRY;
    }else{
      assert( mxReadMark<=pWal->hdr.mxFrame );
      pWal->readLock = (i16)mxI;
    }
  }
  return rc;
}